

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::copy_fromHModelToHPresolve(HModel *this,HPresolve *ptr_model)

{
  int iVar1;
  
  iVar1 = this->numRow;
  (ptr_model->super_HPreData).numCol = this->numCol;
  (ptr_model->super_HPreData).numRow = iVar1;
  (ptr_model->super_HPreData).numTot = this->numTot;
  std::vector<int,_std::allocator<int>_>::operator=
            (&(ptr_model->super_HPreData).Astart,&this->Astart);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(ptr_model->super_HPreData).Aindex,&this->Aindex);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(ptr_model->super_HPreData).Avalue,&this->Avalue);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(ptr_model->super_HPreData).colCost,&this->colCost);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(ptr_model->super_HPreData).colLower,&this->colLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(ptr_model->super_HPreData).colUpper,&this->colUpper);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(ptr_model->super_HPreData).rowLower,&this->rowLower);
  std::vector<double,_std::allocator<double>_>::operator=
            (&(ptr_model->super_HPreData).rowUpper,&this->rowUpper);
  std::__cxx11::string::_M_assign((string *)&ptr_model->modelName);
  return;
}

Assistant:

void HModel::copy_fromHModelToHPresolve(HPresolve *ptr_model) {
  ptr_model->numCol  = numCol;
  ptr_model->numRow  = numRow;
  ptr_model->numTot  = numTot;
  ptr_model->Astart  = Astart;
  ptr_model->Aindex  = Aindex;
  ptr_model->Avalue  = Avalue;
  ptr_model->colCost = colCost;
  ptr_model->colLower= colLower;
  ptr_model->colUpper= colUpper;
  ptr_model->rowLower= rowLower;
  ptr_model->rowUpper= rowUpper;
  
  ptr_model->modelName = modelName;
}